

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O2

void __thiscall
tchecker::parsing::clock_declaration_t::~clock_declaration_t(clock_declaration_t *this)

{
  std::__cxx11::string::~string((string *)&this->_name);
  inner_declaration_t::~inner_declaration_t(&this->super_inner_declaration_t);
  return;
}

Assistant:

clock_declaration_t::~clock_declaration_t() = default;